

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O0

void __thiscall SQCompilation::CodegenVisitor::visitDeclGroup(CodegenVisitor *this,DeclGroup *group)

{
  ArenaVector<SQCompilation::VarDecl_*> *this_00;
  Node *this_01;
  DeclGroup *in_RSI;
  Decl *d;
  const_iterator __end1;
  const_iterator __begin1;
  ArenaVector<SQCompilation::VarDecl_*> *__range1;
  ArenaVector<SQCompilation::VarDecl_*> *declarations;
  Statement *in_stack_ffffffffffffffc8;
  CodegenVisitor *in_stack_ffffffffffffffd0;
  Node *local_28;
  
  addLineNumber(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  this_00 = DeclGroup::declarations(in_RSI);
  local_28 = (Node *)ArenaVector<SQCompilation::VarDecl_*>::begin(this_00);
  this_01 = (Node *)ArenaVector<SQCompilation::VarDecl_*>::end(this_00);
  for (; local_28 != this_01; local_28 = (Node *)&local_28->_coordinates) {
    Node::visit<SQCompilation::CodegenVisitor>
              (this_01,(CodegenVisitor *)(local_28->super_ArenaObj)._vptr_ArenaObj);
  }
  return;
}

Assistant:

void CodegenVisitor::visitDeclGroup(DeclGroup *group) {
    addLineNumber(group);
    const auto &declarations = group->declarations();

    for (Decl *d : declarations) {
        d->visit(this);
    }
}